

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O1

void __thiscall
CScriptNum::CScriptNum
          (CScriptNum *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *vch,
          bool fRequireMinimal,size_t nMaxNumSize)

{
  pointer puVar1;
  pointer puVar2;
  int64_t iVar3;
  runtime_error *prVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = (vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (vch->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = (long)puVar2 - (long)puVar1;
  if (nMaxNumSize < uVar5) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"script number overflow","");
    std::runtime_error::runtime_error(prVar4,(string *)local_48);
    *(undefined ***)prVar4 = &PTR__runtime_error_003dc3f0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(prVar4,&scriptnum_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (((fRequireMinimal && puVar2 != puVar1) && ((puVar2[-1] & 0x7f) == 0)) &&
          ((uVar5 < 2 || (-1 < (char)puVar1[uVar5 - 2])))) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"non-minimally encoded script number","");
    std::runtime_error::runtime_error(prVar4,(string *)local_48);
    *(undefined ***)prVar4 = &PTR__runtime_error_003dc3f0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(prVar4,&scriptnum_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    iVar3 = set_vch(vch);
    this->m_value = iVar3;
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit CScriptNum(const std::vector<unsigned char>& vch, bool fRequireMinimal,
                        const size_t nMaxNumSize = nDefaultMaxNumSize)
    {
        if (vch.size() > nMaxNumSize) {
            throw scriptnum_error("script number overflow");
        }
        if (fRequireMinimal && vch.size() > 0) {
            // Check that the number is encoded with the minimum possible
            // number of bytes.
            //
            // If the most-significant-byte - excluding the sign bit - is zero
            // then we're not minimal. Note how this test also rejects the
            // negative-zero encoding, 0x80.
            if ((vch.back() & 0x7f) == 0) {
                // One exception: if there's more than one byte and the most
                // significant bit of the second-most-significant-byte is set
                // it would conflict with the sign bit. An example of this case
                // is +-255, which encode to 0xff00 and 0xff80 respectively.
                // (big-endian).
                if (vch.size() <= 1 || (vch[vch.size() - 2] & 0x80) == 0) {
                    throw scriptnum_error("non-minimally encoded script number");
                }
            }
        }
        m_value = set_vch(vch);
    }